

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blas0.cpp
# Opt level: O0

complex<double> zsign2(complex<double> z1,complex<double> z2)

{
  undefined8 extraout_RDX;
  undefined8 uVar1;
  complex<double> *this;
  undefined8 in_XMM0_Qa;
  double dVar2;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  complex<double> z;
  complex<double> z_00;
  complex<double> cVar3;
  complex<double> cVar4;
  double local_98;
  complex<double> local_90 [2];
  double local_70 [3];
  complex<double> local_58 [2];
  undefined1 local_38 [8];
  complex<double> z2_local;
  complex<double> z1_local;
  complex<double> value;
  
  uVar1 = z1._M_value._8_8_;
  this = (complex<double> *)(z1_local._M_value + 8);
  local_38 = (undefined1  [8])in_XMM2_Qa;
  z2_local._M_value._0_8_ = in_XMM3_Qa;
  z2_local._M_value._8_8_ = in_XMM0_Qa;
  z1_local._M_value._0_8_ = in_XMM1_Qa;
  std::complex<double>::complex(this,0.0,0.0);
  local_58[1]._M_value._0_8_ = local_38;
  local_58[1]._M_value._8_8_ = z2_local._M_value._0_8_;
  cVar3._M_value._8_8_ = uVar1;
  cVar3._M_value._0_8_ = this;
  dVar2 = zabs2(cVar3);
  if ((dVar2 != 0.0) || (NAN(dVar2))) {
    local_90[1]._M_value._0_8_ = z2_local._M_value._8_8_;
    local_90[1]._M_value._8_8_ = z1_local._M_value._0_8_;
    z._M_value._8_8_ = uVar1;
    z._M_value._0_8_ = this;
    local_70[0] = zabs2(z);
    z_00._M_value._8_8_ = uVar1;
    z_00._M_value._0_8_ = this;
    local_98 = zabs2(z_00);
    std::operator/((complex<double> *)local_38,&local_98);
    local_58[0]._M_value._8_8_ = z2_local._M_value._0_8_;
    cVar3 = std::operator*(local_70,local_90);
    uVar1 = cVar3._M_value._8_8_;
  }
  else {
    std::complex<double>::complex(local_58,0.0,0.0);
    uVar1 = extraout_RDX;
  }
  cVar4._M_value._8_8_ = uVar1;
  cVar4._M_value._0_8_ = local_58[0]._M_value._8_8_;
  return (complex<double>)cVar4._M_value;
}

Assistant:

complex <double> zsign2 ( complex <double> z1, complex <double> z2 )

//****************************************************************************80
//
//  Purpose:
//
//    ZSIGN2 is a complex <double> transfer-of-sign function.
//
//  Discussion:
//
//    This routine uses double precision complex arithmetic.
//
//    The L2 norm is used.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    15 April 2006
//
//  Author:
//
//    John Burkardt
//
//  Parameters:
//
//    Input, complex <double> Z1, Z2, the arguments.
//
//    Output, complex <double> ZSIGN2,  a complex value, with the magnitude of
//    Z1, and the argument of Z2.
//
{
  complex <double> value;

  if ( zabs2 ( z2 ) == 0.0 )
  {
    value = complex <double> ( 0.0, 0.0 );
  }
  else
  {
    value = zabs2 ( z1 ) * ( z2 / zabs2 ( z2 ) );
  }

  return value;
}